

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O1

int32_t uloc_getVariant_63(char *localeID,char *variant,int32_t variantCapacity,UErrorCode *err)

{
  int32_t iVar1;
  char *pcVar2;
  char *tmpLocaleID;
  char *cntryID;
  char *scriptID;
  char tempBuffer [157];
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char local_c8 [160];
  
  iVar1 = 0;
  if ((err != (UErrorCode *)0x0) && (*err < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (localeID == (char *)0x0) {
      local_e0 = locale_get_default_63();
    }
    else {
      pcVar2 = strchr(localeID,0x40);
      local_e0 = localeID;
      if ((pcVar2 == (char *)0x0) &&
         (iVar1 = getShortestSubtagLength(localeID), local_e0 = localeID, iVar1 == 1)) {
        iVar1 = uloc_forLanguageTag_63(localeID,local_c8,0x9d,(int32_t *)0x0,err);
        if (((iVar1 < 1) ||
            (local_e0 = local_c8, U_ZERO_ERROR < *err || *err == U_STRING_NOT_TERMINATED_WARNING))
           && (local_e0 = localeID, *err == U_STRING_NOT_TERMINATED_WARNING)) {
          *err = U_BUFFER_OVERFLOW_ERROR;
          local_e0 = localeID;
        }
      }
    }
    iVar1 = 0;
    ulocimp_getLanguage_63(local_e0,(char *)0x0,0,&local_e0);
    if ((*local_e0 == '_') || (*local_e0 == '-')) {
      iVar1 = 0;
      ulocimp_getScript_63(local_e0 + 1,(char *)0x0,0,&local_d0);
      if (local_d0 != local_e0 + 1) {
        local_e0 = local_d0;
      }
      if ((*local_e0 == '_') || (*local_e0 == '-')) {
        iVar1 = 0;
        ulocimp_getCountry_63(local_e0 + 1,(char *)0x0,0,&local_d8);
        if (local_d8 != local_e0 + 1) {
          local_e0 = local_d8;
        }
        if ((*local_e0 == '_') || (*local_e0 == '-')) {
          if ((local_e0 != local_d8) && ((local_e0[1] == '_' || (local_e0[1] == '-')))) {
            local_e0 = local_e0 + 1;
          }
          iVar1 = _getVariantEx(local_e0 + 1,*local_e0,variant,variantCapacity,'\0');
        }
      }
    }
    iVar1 = u_terminateChars_63(variant,variantCapacity,iVar1,err);
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t  U_EXPORT2
uloc_getVariant(const char* localeID,
                char* variant,
                int32_t variantCapacity,
                UErrorCode* err)
{
    char tempBuffer[ULOC_FULLNAME_CAPACITY];
    const char* tmpLocaleID;
    int32_t i=0;

    if(err==NULL || U_FAILURE(*err)) {
        return 0;
    }

    if (_hasBCP47Extension(localeID)) {
        _ConvertBCP47(tmpLocaleID, localeID, tempBuffer, sizeof(tempBuffer), err);
    } else {
        if (localeID==NULL) {
           localeID=uloc_getDefault();
        }
        tmpLocaleID=localeID;
    }

    /* Skip the language */
    ulocimp_getLanguage(tmpLocaleID, NULL, 0, &tmpLocaleID);
    if(_isIDSeparator(*tmpLocaleID)) {
        const char *scriptID;
        /* Skip the script if available */
        ulocimp_getScript(tmpLocaleID+1, NULL, 0, &scriptID);
        if(scriptID != tmpLocaleID+1) {
            /* Found optional script */
            tmpLocaleID = scriptID;
        }
        /* Skip the Country */
        if (_isIDSeparator(*tmpLocaleID)) {
            const char *cntryID;
            ulocimp_getCountry(tmpLocaleID+1, NULL, 0, &cntryID);
            if (cntryID != tmpLocaleID+1) {
                /* Found optional country */
                tmpLocaleID = cntryID;
            }
            if(_isIDSeparator(*tmpLocaleID)) {
                /* If there was no country ID, skip a possible extra IDSeparator */
                if (tmpLocaleID != cntryID && _isIDSeparator(tmpLocaleID[1])) {
                    tmpLocaleID++;
                }
                i=_getVariant(tmpLocaleID+1, *tmpLocaleID, variant, variantCapacity);
            }
        }
    }

    /* removed by weiv. We don't want to handle POSIX variants anymore. Use canonicalization function */
    /* if we do not have a variant tag yet then try a POSIX variant after '@' */
/*
    if(!haveVariant && (localeID=uprv_strrchr(localeID, '@'))!=NULL) {
        i=_getVariant(localeID+1, '@', variant, variantCapacity);
    }
*/
    return u_terminateChars(variant, variantCapacity, i, err);
}